

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  int i;
  long lVar2;
  MethodDescriptor *method;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; pSVar1 = (this->super_ServiceGenerator).descriptor_,
      lVar2 < *(int *)(pSVar1 + 0x28); lVar2 = lVar2 + 1) {
    method = (MethodDescriptor *)(*(long *)(pSVar1 + 0x20) + lVar3);
    WriteMethodDocComment(printer,method);
    GenerateMethodSignature(this,printer,method,IS_ABSTRACT);
    io::Printer::Print<>(printer,";\n\n");
    lVar3 = lVar3 + 0x68;
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method);
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}